

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_pass_resp(connectdata *conn,int pop3code,pop3state instate)

{
  SessionHandle *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  if (pop3code == 0x2b) {
    state(conn,POP3_STOP);
  }
  else {
    Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)pop3code);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_pass_resp(struct connectdata *conn, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied. %c", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else
    /* End of connect phase */
    state(conn, POP3_STOP);

  return result;
}